

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::JavaHprofConfig::Serialize(JavaHprofConfig *this,Message *msg)

{
  pointer pbVar1;
  unsigned_long *puVar2;
  _Head_base<0UL,_perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig_*,_false> this_00;
  uint8_t *src_begin;
  Message *msg_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  unsigned_long *puVar3;
  pointer pbVar4;
  
  pbVar1 = (this->process_cmdline_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (this->process_cmdline_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    protozero::Message::AppendBytes(msg,1,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
  }
  puVar2 = (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,2,*puVar3);
  }
  pbVar1 = (this->target_installed_by_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (this->target_installed_by_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    protozero::Message::AppendBytes(msg,7,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 8) != 0) {
    this_00._M_head_impl =
         (this->continuous_dump_config_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig,_std::default_delete<perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig_*,_std::default_delete<perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig>_>
         .
         super__Head_base<0UL,_perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig_*,_false>
         ._M_head_impl;
    msg_00 = protozero::Message::BeginNestedMessageInternal(msg,3);
    JavaHprofConfig_ContinuousDumpConfig::Serialize(this_00._M_head_impl,msg_00);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 0x10) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,4,this->min_anonymous_memory_kb_);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 0x20) != 0) {
    protozero::Message::AppendTinyVarInt(msg,5,(uint)this->dump_smaps_);
  }
  pbVar1 = (this->ignored_types_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (this->ignored_types_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    protozero::Message::AppendBytes(msg,6,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void JavaHprofConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: process_cmdline
  for (auto& it : process_cmdline_) {
    msg->AppendString(1, it);
  }

  // Field 2: pid
  for (auto& it : pid_) {
    msg->AppendVarInt(2, it);
  }

  // Field 7: target_installed_by
  for (auto& it : target_installed_by_) {
    msg->AppendString(7, it);
  }

  // Field 3: continuous_dump_config
  if (_has_field_[3]) {
    (*continuous_dump_config_).Serialize(msg->BeginNestedMessage<::protozero::Message>(3));
  }

  // Field 4: min_anonymous_memory_kb
  if (_has_field_[4]) {
    msg->AppendVarInt(4, min_anonymous_memory_kb_);
  }

  // Field 5: dump_smaps
  if (_has_field_[5]) {
    msg->AppendTinyVarInt(5, dump_smaps_);
  }

  // Field 6: ignored_types
  for (auto& it : ignored_types_) {
    msg->AppendString(6, it);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}